

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_uri_key(char *zFilename,int N)

{
  uint uVar1;
  undefined8 in_RAX;
  char *pcVar2;
  
  if (N < 0 || zFilename == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = databaseName((char *)CONCAT71((int7)((ulong)in_RAX >> 8),zFilename == (char *)0x0));
    while( true ) {
      uVar1 = sqlite3Strlen30(pcVar2);
      pcVar2 = pcVar2 + (ulong)uVar1 + 1;
      if ((*pcVar2 == '\0') || (N < 1)) break;
      N = N + -1;
      uVar1 = sqlite3Strlen30(pcVar2);
      pcVar2 = pcVar2 + (ulong)uVar1 + 1;
    }
    if (*pcVar2 == '\0') {
      pcVar2 = (char *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

SQLITE_API const char *sqlite3_uri_key(const char *zFilename, int N){
  if( zFilename==0 || N<0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] && (N--)>0 ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename[0] ? zFilename : 0;
}